

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_igen_chunk.cpp
# Opt level: O2

void __thiscall sf2cute::SFRIFFIgenChunk::Write(SFRIFFIgenChunk *this,ostream *out)

{
  _Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  _Var1;
  long lVar2;
  size_type sVar3;
  element_type *peVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  invalid_argument *piVar7;
  out_of_range *this_00;
  pointer psVar8;
  SFGeneratorItem **generator_1;
  _Alloc_hider _Var9;
  SFGeneratorItem **generator;
  pointer puVar10;
  string local_80;
  pointer local_60;
  _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  key_type local_50;
  SFRIFFIgenChunk *local_48;
  pointer local_40;
  pointer local_38;
  
  std::ios::exceptions((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(&local_80,this);
  RIFFChunk::WriteHeader(out,&local_80,this->size_);
  std::__cxx11::string::~string((string *)&local_80);
  psVar8 = (this->instruments_->
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->instruments_->
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = &(this->sample_index_map_)._M_h;
  local_48 = this;
  do {
    if (psVar8 == local_40) {
      WriteItem(out,kStartAddrsOffset,(GenAmountType)0x0);
      if ((local_48->size_ & 1) != 0) {
        std::operator<<(out,'\0');
      }
      return;
    }
    peVar4 = (psVar8->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    _Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (peVar4->global_zone_)._M_t.
         super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
         ._M_t.
         super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
         .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>;
    local_60 = psVar8;
    if (_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl !=
        (SFInstrumentZone *)0x0) {
      if ((*(long *)((long)_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                           _M_head_impl + 0x40) != 0) &&
         (*(int *)(*(long *)((long)_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                                   _M_head_impl + 0x40) + 8) != 0)) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar7,"Global instrument zone cannot have a link to a sample.");
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                      *)&local_80,
                     (vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                      *)((long)_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                               _M_head_impl + 8));
      sVar3 = local_80._M_string_length;
      for (_Var9._M_p = local_80._M_dataplus._M_p; _Var9._M_p != (pointer)sVar3;
          _Var9._M_p = _Var9._M_p + 8) {
        WriteItem(out,**(SFGenerator **)_Var9._M_p,
                  *(GenAmountType *)(*(SFGenerator **)_Var9._M_p + 1));
      }
      std::_Vector_base<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::
      ~_Vector_base((_Vector_base<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                     *)&local_80);
      peVar4 = (local_60->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    local_38 = (peVar4->zones_).
               super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (peVar4->zones_).
                   super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != local_38;
        puVar10 = puVar10 + 1) {
      SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                      *)&local_80,
                     (vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                      *)((long)(puVar10->_M_t).
                               super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false> + 8));
      sVar3 = local_80._M_string_length;
      for (_Var9._M_p = local_80._M_dataplus._M_p; _Var9._M_p != (pointer)sVar3;
          _Var9._M_p = _Var9._M_p + 8) {
        WriteItem(out,**(SFGenerator **)_Var9._M_p,
                  *(GenAmountType *)(*(SFGenerator **)_Var9._M_p + 1));
      }
      std::_Vector_base<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>::
      ~_Vector_base((_Vector_base<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                     *)&local_80);
      _Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
           (puVar10->_M_t).
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>;
      lVar2 = *(long *)((long)_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                              _M_head_impl + 0x40);
      if ((lVar2 == 0) || (*(int *)(lVar2 + 8) == 0)) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar7,"Instrument zone must have a link to a sample.");
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)&local_80,
                 (long)_Var1.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl
                 + 0x38);
      local_50 = (key_type)local_80._M_dataplus._M_p;
      sVar5 = std::
              _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(local_58,&local_50);
      if (sVar5 == 0) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Instrument zone points to an unknown sample.");
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      local_50 = (key_type)local_80._M_dataplus._M_p;
      pmVar6 = std::__detail::
               _Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)local_58,&local_50);
      WriteItem(out,kSampleID,(GenAmountType)*pmVar6);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
    }
    psVar8 = local_60 + 1;
  } while( true );
}

Assistant:

void SFRIFFIgenChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Instruments:
    for (const auto & instrument : instruments()) {
      // Global zone:
      if (instrument->has_global_zone()) {
        // Check the sample for the global zone.
        if (instrument->global_zone().has_sample()) {
          // Throw exception if the global zone has a link to a sample.
          throw std::invalid_argument("Global instrument zone cannot have a link to a sample.");
        }

        // Write all the generators in the global zone.
        for (const auto & generator : SortGenerators(instrument->global_zone().generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }
      }

      // Instrument zones:
      for (const auto & zone : instrument->zones()) {
        // Write all the generators in the instrument zone.
        for (const auto & generator : SortGenerators(zone->generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }

        // Check the sample for the zone.
        if (zone->has_sample()) {
          // Find the index number for the sample.
          const auto & sample = zone->sample();
          if (sample_index_map().count(sample.get()) != 0) {
            // Write the sampleID generator.
            GenAmountType sample_index(sample_index_map().at(sample.get()));
            WriteItem(out, SFGenerator::kSampleID, sample_index);
          }
          else {
            // Throw exception if the sample could not be found in the index map.
            throw std::out_of_range("Instrument zone points to an unknown sample.");
          }
        }
        else {
          // Throw exception if the instrument zone does not have a link to a sample.
          throw std::invalid_argument("Instrument zone must have a link to a sample.");
        }
      }
    }

    // Write the last terminator item.
    WriteItem(out, SFGenerator(0), GenAmountType(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}